

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void math2Func(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  sqlite3_context *pCtx;
  sqlite3_context *in_RDI;
  double dVar2;
  double dVar3;
  _func_double_double_double *x;
  double ans;
  double v1;
  double v0;
  int type1;
  int type0;
  double in_stack_ffffffffffffffb8;
  sqlite3_value *pVal;
  
  pVal = (sqlite3_value *)&DAT_aaaaaaaaaaaaaaaa;
  iVar1 = sqlite3_value_numeric_type((sqlite3_value *)&DAT_aaaaaaaaaaaaaaaa);
  if (((iVar1 == 1) || (iVar1 == 2)) &&
     ((iVar1 = sqlite3_value_numeric_type(pVal), iVar1 == 1 || (iVar1 == 2)))) {
    dVar2 = sqlite3_value_double((sqlite3_value *)0x2266d2);
    dVar3 = sqlite3_value_double((sqlite3_value *)0x2266e6);
    pCtx = (sqlite3_context *)sqlite3_user_data(in_RDI);
    (*(code *)pCtx)(dVar2,dVar3);
    sqlite3_result_double(pCtx,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

static void math2Func(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int type0, type1;
  double v0, v1, ans;
  double (*x)(double,double);
  assert( argc==2 );
  type0 = sqlite3_value_numeric_type(argv[0]);
  if( type0!=SQLITE_INTEGER && type0!=SQLITE_FLOAT ) return;
  type1 = sqlite3_value_numeric_type(argv[1]);
  if( type1!=SQLITE_INTEGER && type1!=SQLITE_FLOAT ) return;
  v0 = sqlite3_value_double(argv[0]);
  v1 = sqlite3_value_double(argv[1]);
  x = (double(*)(double,double))sqlite3_user_data(context);
  ans = x(v0, v1);
  sqlite3_result_double(context, ans);
}